

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

int __thiscall fmt::File::pipe(File *this,int *__pipedes)

{
  int iVar1;
  int extraout_EAX;
  SystemError *this_00;
  int *piVar2;
  int __fd;
  int fds [2];
  File local_24;
  int local_20 [2];
  
  piVar2 = __pipedes;
  close(this,(int)__pipedes);
  __fd = (int)piVar2;
  close((File *)__pipedes,__fd);
  local_20[0] = 0;
  local_20[1] = 0;
  iVar1 = ::pipe(local_20);
  if (iVar1 == 0) {
    iVar1 = local_20[0];
    local_24.fd_ = local_20[0];
    close(this,__fd);
    this->fd_ = iVar1;
    local_24.fd_ = -1;
    ~File(&local_24);
    iVar1 = local_20[1];
    local_24.fd_ = local_20[1];
    close((File *)__pipedes,__fd);
    *__pipedes = iVar1;
    local_24.fd_ = -1;
    ~File(&local_24);
    return extraout_EAX;
  }
  this_00 = (SystemError *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  SystemError::SystemError(this_00,*piVar2,(CStringRef)0x17661e);
  __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
}

Assistant:

void fmt::File::pipe(File &read_end, File &write_end) {
  // Close the descriptors first to make sure that assignments don't throw
  // and there are no leaks.
  read_end.close();
  write_end.close();
  int fds[2] = {};
#ifdef _WIN32
  // Make the default pipe capacity same as on Linux 2.6.11+.
  enum { DEFAULT_CAPACITY = 65536 };
  int result = FMT_POSIX_CALL(pipe(fds, DEFAULT_CAPACITY, _O_BINARY));
#else
  // Don't retry as the pipe function doesn't return EINTR.
  // http://pubs.opengroup.org/onlinepubs/009696799/functions/pipe.html
  int result = FMT_POSIX_CALL(pipe(fds));
#endif
  if (result != 0)
    FMT_THROW(SystemError(errno, "cannot create pipe"));
  // The following assignments don't throw because read_fd and write_fd
  // are closed.
  read_end = File(fds[0]);
  write_end = File(fds[1]);
}